

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat_room.cpp
# Opt level: O0

void __thiscall ChatRoom::message(ChatRoom *this,string *origin,string *dest,string *message)

{
  bool bVar1;
  __shared_ptr_access<Person,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
  local_50;
  string *local_48;
  shared_ptr<Person> *local_40;
  __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
  local_38;
  __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
  local_30;
  __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
  it;
  string *message_local;
  string *dest_local;
  string *origin_local;
  ChatRoom *this_local;
  
  it._M_current = (shared_ptr<Person> *)message;
  local_38._M_current =
       (shared_ptr<Person> *)
       std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>::begin
                 (&this->m_people);
  local_40 = (shared_ptr<Person> *)
             std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>::end
                       (&this->m_people);
  local_48 = dest;
  local_30 = std::
             find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Person>*,std::vector<std::shared_ptr<Person>,std::allocator<std::shared_ptr<Person>>>>,ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                       (local_38,(__normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
                                  )local_40,(anon_class_8_1_898aaba0_for__M_pred)dest);
  local_50._M_current =
       (shared_ptr<Person> *)
       std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>::end
                 (&this->m_people);
  bVar1 = __gnu_cxx::operator!=(&local_30,&local_50);
  if (bVar1) {
    this_00 = (__shared_ptr_access<Person,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
              ::operator*(&local_30);
    this_01 = std::__shared_ptr_access<Person,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        (this_00);
    Person::recieve(this_01,origin,(string *)it._M_current);
  }
  return;
}

Assistant:

void ChatRoom::message(const std::string& origin, const std::string& dest, const std::string& message)
{
	auto it{std::find_if(m_people.begin(), m_people.end(), [&dest] (const auto& p)
			{
				return p->m_name == dest;
			})};

	if(it != m_people.end())
	{
		(*it)->recieve(origin, message);
	};
}